

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t update_encoder_cfg(aom_codec_alg_priv_t_conflict *ctx)

{
  int iVar1;
  long in_RDI;
  aom_internal_error_info *error_1;
  AV1_COMP *cpi_lap;
  aom_internal_error_info *error;
  AV1_COMP *cpi;
  int i;
  _Bool is_sb_size_changed;
  _Bool in_stack_00000067;
  AV1EncoderConfig *in_stack_00000068;
  AV1_COMP *in_stack_00000070;
  av1_extracfg *in_stack_000000b0;
  aom_codec_enc_cfg_t *in_stack_000000b8;
  AV1EncoderConfig *in_stack_000000c0;
  AV1EncoderConfig *in_stack_ffffffffffffffd0;
  AV1_PRIMARY *in_stack_ffffffffffffffd8;
  aom_codec_err_t *paVar2;
  int local_18;
  
  set_encoder_config(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
  av1_check_fpmt_config(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  av1_change_config_seq(_i,(AV1EncoderConfig *)cpi,(_Bool *)error);
  for (local_18 = 0; local_18 < *(int *)(*(long *)(in_RDI + 0xb50) + 0x148); local_18 = local_18 + 1
      ) {
    paVar2 = *(aom_codec_err_t **)
              (*(long *)(*(long *)(in_RDI + 0xb50) + (long)local_18 * 8) + 0x3bfb0);
    iVar1 = _setjmp((__jmp_buf_tag *)(paVar2 + 0x36));
    if (iVar1 != 0) {
      paVar2[0x34] = AOM_CODEC_OK;
      return *paVar2;
    }
    paVar2[0x34] = AOM_CODEC_ERROR;
    av1_change_config(in_stack_00000070,in_stack_00000068,in_stack_00000067);
    paVar2[0x34] = AOM_CODEC_OK;
  }
  if (*(long *)(*(long *)(in_RDI + 0xb50) + 0x168) != 0) {
    paVar2 = *(aom_codec_err_t **)(*(long *)(*(long *)(in_RDI + 0xb50) + 0x168) + 0x3bfb0);
    iVar1 = _setjmp((__jmp_buf_tag *)(paVar2 + 0x36));
    if (iVar1 != 0) {
      paVar2[0x34] = AOM_CODEC_OK;
      return *paVar2;
    }
    paVar2[0x34] = AOM_CODEC_ERROR;
    av1_change_config(in_stack_00000070,in_stack_00000068,in_stack_00000067);
    paVar2[0x34] = AOM_CODEC_OK;
  }
  return AOM_CODEC_OK;
}

Assistant:

static aom_codec_err_t update_encoder_cfg(aom_codec_alg_priv_t *ctx) {
  set_encoder_config(&ctx->oxcf, &ctx->cfg, &ctx->extra_cfg);
  av1_check_fpmt_config(ctx->ppi, &ctx->oxcf);
  bool is_sb_size_changed = false;
  av1_change_config_seq(ctx->ppi, &ctx->oxcf, &is_sb_size_changed);
  for (int i = 0; i < ctx->ppi->num_fp_contexts; i++) {
    AV1_COMP *const cpi = ctx->ppi->parallel_cpi[i];
    struct aom_internal_error_info *const error = cpi->common.error;
    if (setjmp(error->jmp)) {
      error->setjmp = 0;
      return error->error_code;
    }
    error->setjmp = 1;
    av1_change_config(cpi, &ctx->oxcf, is_sb_size_changed);
    error->setjmp = 0;
  }
  if (ctx->ppi->cpi_lap != NULL) {
    AV1_COMP *const cpi_lap = ctx->ppi->cpi_lap;
    struct aom_internal_error_info *const error = cpi_lap->common.error;
    if (setjmp(error->jmp)) {
      error->setjmp = 0;
      return error->error_code;
    }
    error->setjmp = 1;
    av1_change_config(cpi_lap, &ctx->oxcf, is_sb_size_changed);
    error->setjmp = 0;
  }
  return AOM_CODEC_OK;
}